

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGOp * tcg_op_alloc(TCGContext_conflict9 *s,TCGOpcode opc)

{
  TCGOp *local_20;
  TCGOp *op;
  TCGOpcode opc_local;
  TCGContext_conflict9 *s_local;
  
  if ((s->free_ops).tqh_first == (TCGOp *)0x0) {
    local_20 = (TCGOp *)tcg_malloc(s,0x78);
  }
  else {
    local_20 = (s->free_ops).tqh_first;
    if ((local_20->link).tqe_next == (TCGOp *)0x0) {
      (s->free_ops).tqh_circ.tql_prev = (local_20->link).tqe_circ.tql_prev;
    }
    else {
      (((local_20->link).tqe_next)->link).tqe_circ.tql_prev = (local_20->link).tqe_circ.tql_prev;
    }
    ((local_20->link).tqe_circ.tql_prev)->tql_next = (local_20->link).tqe_next;
    (local_20->link).tqe_circ.tql_prev = (QTailQLink *)0x0;
    (local_20->link).tqe_next = (TCGOp *)0x0;
    (local_20->link).tqe_next = (TCGOp *)0x0;
  }
  memset(local_20,0,8);
  *(TCGOpcode *)local_20 =
       *(TCGOpcode *)local_20 & ~(INDEX_op_mulsh_i64|INDEX_op_muluh_i64) |
       opc & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
  s->nb_ops = s->nb_ops + 1;
  return local_20;
}

Assistant:

static TCGOp *tcg_op_alloc(TCGContext *s, TCGOpcode opc)
{
    TCGOp *op;

    if (likely(QTAILQ_EMPTY(&s->free_ops))) {
        op = tcg_malloc(s, sizeof(TCGOp));
    } else {
        op = QTAILQ_FIRST(&s->free_ops);
        QTAILQ_REMOVE(&s->free_ops, op, link);
    }
    memset(op, 0, offsetof(TCGOp, link));
    op->opc = opc;
    s->nb_ops++;

    return op;
}